

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::ConcurrentAssertionStatement::fromSyntax
          (Compilation *compilation,ConcurrentAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ElseClauseSyntax *pEVar1;
  AssertionKind AVar2;
  int iVar3;
  ProceduralBlockSymbol *pPVar4;
  Diagnostic *this;
  Statement *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConcurrentAssertionStatement *stmt;
  ActionBlockSyntax *pAVar6;
  socklen_t __len;
  Compilation *compilation_00;
  not_null<slang::syntax::ActionBlockSyntax_*> *pnVar7;
  DiagCode code;
  bool bVar8;
  SourceRange SVar9;
  string_view arg;
  AssertionKind assertKind;
  Statement *ifFalse;
  Statement *ifTrue;
  ASTContext ctx;
  AssertionKind local_9c;
  Compilation *local_98;
  Statement *local_90;
  Statement *local_88;
  AssertionExpr *local_80;
  ASTContext local_78;
  SourceRange local_40;
  
  if (((context->flags).m_bits & 0x1000000) != 0) {
    SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    this = ASTContext::addDiag(context,(DiagCode)0xe0008,SVar9);
    arg = parsing::Token::valueText(&syntax->keyword);
    Diagnostic::operator<<(this,arg);
LAB_0045d7f8:
    pSVar5 = Statement::badStmt(compilation,(Statement *)0x0);
    return pSVar5;
  }
  AVar2 = SemanticFacts::getAssertKind((syntax->super_StatementSyntax).super_SyntaxNode.kind);
  local_9c = AVar2;
  pPVar4 = ASTContext::getProceduralBlock(context);
  if ((AVar2 != Expect) &&
     ((pPVar4 == (ProceduralBlockSymbol *)0x0 || (pPVar4->procedureKind == Final)))) {
    SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0xf0008,SVar9);
    goto LAB_0045d7f8;
  }
  local_78.scope.ptr = (context->scope).ptr;
  local_78.lookupIndex = context->lookupIndex;
  local_78._12_4_ = *(undefined4 *)&context->field_0xc;
  local_78.flags.m_bits = (context->flags).m_bits;
  local_78.firstTempVar = context->firstTempVar;
  local_78.randomizeDetails = context->randomizeDetails;
  local_78.assertionInstance = context->assertionInstance;
  local_78.instanceOrProc = (Symbol *)0x0;
  iVar3 = AssertionExpr::bind((int)(syntax->propertySpec).ptr,(sockaddr *)&local_78,__len);
  local_80 = (AssertionExpr *)CONCAT44(extraout_var,iVar3);
  bVar8 = local_80->kind == Invalid;
  local_78.flags.m_bits = local_78.flags.m_bits | 0x1000000;
  local_88 = (Statement *)0x0;
  local_90 = (Statement *)0x0;
  pnVar7 = &syntax->action;
  pAVar6 = (syntax->action).ptr;
  local_98 = compilation;
  if (pAVar6->statement != (StatementSyntax *)0x0) {
    iVar3 = Statement::bind((int)pAVar6->statement,(sockaddr *)&local_78,(socklen_t)stmtCtx);
    local_88 = (Statement *)CONCAT44(extraout_var_00,iVar3);
    pAVar6 = pnVar7->ptr;
  }
  pEVar1 = pAVar6->elseClause;
  if (pEVar1 == (ElseClauseSyntax *)0x0) {
    compilation_00 = local_98;
    if (((AVar2 != Restrict) || (local_88 == (Statement *)0x0)) ||
       (code.subsystem = Statements, code.code = 0x40, local_88->kind == Empty)) goto LAB_0045d950;
  }
  else {
    iVar3 = Statement::bind((int)(pEVar1->clause).ptr,(sockaddr *)&local_78,(socklen_t)stmtCtx);
    local_90 = (Statement *)CONCAT44(extraout_var_01,iVar3);
    if (((AVar2 & ~Assume) == CoverProperty) && (pEVar1 != (ElseClauseSyntax *)0x0)) {
      pnVar7 = (not_null<slang::syntax::ActionBlockSyntax_*> *)&pnVar7->ptr->elseClause;
      code.subsystem = Statements;
      code.code = 0x10;
    }
    else {
      code.subsystem = Statements;
      code.code = 0x40;
      compilation_00 = local_98;
      if (AVar2 != Restrict) goto LAB_0045d950;
    }
  }
  compilation_00 = local_98;
  SVar9 = slang::syntax::SyntaxNode::sourceRange(&pnVar7->ptr->super_SyntaxNode);
  ASTContext::addDiag(&local_78,code,SVar9);
  bVar8 = true;
LAB_0045d950:
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ConcurrentAssertionStatement,slang::ast::AssertionKind&,slang::ast::AssertionExpr_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                   (&compilation_00->super_BumpAllocator,&local_9c,local_80,&local_88,&local_90,
                    &local_40);
  if ((((bVar8) || ((local_88 != (Statement *)0x0 && (local_88->kind == Invalid)))) ||
      ((local_90 != (Statement *)0x0 && (local_90->kind == Invalid)))) ||
     ((local_9c == Expect &&
      (bVar8 = ASTContext::requireTimingAllowed(context,(stmt->super_Statement).sourceRange), !bVar8
      )))) {
    stmt = (ConcurrentAssertionStatement *)Statement::badStmt(compilation_00,&stmt->super_Statement)
    ;
  }
  return &stmt->super_Statement;
}

Assistant:

Statement& ConcurrentAssertionStatement::fromSyntax(
    Compilation& compilation, const ConcurrentAssertionStatementSyntax& syntax,
    const ASTContext& context, StatementContext& stmtCtx) {

    if (context.flags.has(ASTFlags::ConcurrentAssertActionBlock)) {
        context.addDiag(diag::ConcurrentAssertActionBlock, syntax.sourceRange())
            << syntax.keyword.valueText();
        return badStmt(compilation, nullptr);
    }

    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);

    auto proc = context.getProceduralBlock();
    if (assertKind != AssertionKind::Expect &&
        (!proc || proc->procedureKind == ProceduralBlockKind::Final)) {
        context.addDiag(diag::ConcurrentAssertNotInProc, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    ASTContext ctx = context;
    ctx.clearInstanceAndProc();

    auto& prop = AssertionExpr::bind(*syntax.propertySpec, ctx);
    bool bad = prop.bad();

    ctx.flags |= ASTFlags::ConcurrentAssertActionBlock;
    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, ctx, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(), ctx,
                                   stmtCtx);
    }

    const bool isCover = assertKind == AssertionKind::CoverProperty ||
                         assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        ctx.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }
    else if (assertKind == AssertionKind::Restrict &&
             (ifFalse || (ifTrue && ifTrue->kind != StatementKind::Empty))) {
        ctx.addDiag(diag::RestrictStmtNoFail, syntax.action->sourceRange());
        bad = true;
    }

    auto result = compilation.emplace<ConcurrentAssertionStatement>(assertKind, prop, ifTrue,
                                                                    ifFalse, syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    if (assertKind == AssertionKind::Expect && !context.requireTimingAllowed(result->sourceRange))
        return badStmt(compilation, result);

    return *result;
}